

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void init_non_blocking_conn(CMConnection conn)

{
  conn->do_non_blocking_write = 0;
  if ((conn->trans->NBwritev_func != (CMTransport_writev_func)0x0) &&
     (conn->trans->set_write_notify != (CMTransport_set_write_notify_func)0x0)) {
    conn->do_non_blocking_write = 1;
  }
  return;
}

Assistant:

static void
 init_non_blocking_conn(CMConnection conn)
 {
     /* default */
     conn->do_non_blocking_write = 0;

     if (conn->trans->NBwritev_func == NULL) return;
     if (conn->trans->set_write_notify == NULL) return;

     /* only if we make it this far should we try non blocking writes */
     conn->do_non_blocking_write = 1;
 }